

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall
HEkkDualRow::chooseFinalLargeAlpha
          (HEkkDualRow *this,HighsInt *breakIndex,HighsInt *breakGroup,HighsInt pass_workCount,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pass_workData,
          vector<int,_std::allocator<int>_> *pass_workGroup)

{
  int iVar1;
  const_reference pvVar2;
  double *pdVar3;
  size_type sVar4;
  const_reference pvVar5;
  int in_ECX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  HighsInt iCol;
  HighsInt jCol;
  HighsInt i_1;
  HighsInt iMaxFinal;
  double dMaxFinal;
  HighsInt iGroup;
  HighsInt countGroup;
  HighsInt i;
  double finalCompare;
  int local_68;
  int local_64;
  double local_60;
  int local_58;
  double local_50;
  double local_48;
  int local_3c;
  double local_38;
  vector<int,_std::allocator<int>_> *local_30;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_28;
  int local_1c;
  int *local_18;
  int *local_10;
  
  local_38 = 0.0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
    pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](local_28,(long)local_3c);
    pdVar3 = std::max<double>(&local_38,&pvVar2->second);
    local_38 = *pdVar3;
  }
  local_48 = local_38 * 0.1;
  local_50 = 1.0;
  pdVar3 = std::min<double>(&local_48,&local_50);
  local_38 = *pdVar3;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_30);
  *local_18 = -1;
  *local_10 = -1;
  local_58 = (int)sVar4 + -2;
  while( true ) {
    if (local_58 < 0) {
      return;
    }
    local_60 = 0.0;
    local_64 = -1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_58);
    for (local_68 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)(local_58 + 1)),
        local_68 < *pvVar5; local_68 = local_68 + 1) {
      pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[](local_28,(long)local_68);
      if (pvVar2->second <= local_60) {
        pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](local_28,(long)local_68);
        if ((local_60 == pvVar2->second) && (!NAN(local_60) && !NAN(pvVar2->second))) {
          pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                   operator[](local_28,(long)local_64);
          iVar1 = pvVar2->first;
          pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                   operator[](local_28,(long)local_68);
          if (*(int *)(*(long *)(in_RDI + 0x10) + (long)pvVar2->first * 4) <
              *(int *)(*(long *)(in_RDI + 0x10) + (long)iVar1 * 4)) {
            local_64 = local_68;
          }
        }
      }
      else {
        pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](local_28,(long)local_68);
        local_60 = pvVar2->second;
        local_64 = local_68;
      }
    }
    pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](local_28,(long)local_64);
    if (local_38 < pvVar2->second) break;
    local_58 = local_58 + -1;
  }
  *local_10 = local_64;
  *local_18 = local_58;
  return;
}

Assistant:

void HEkkDualRow::chooseFinalLargeAlpha(
    HighsInt& breakIndex, HighsInt& breakGroup, HighsInt pass_workCount,
    const std::vector<std::pair<HighsInt, double>>& pass_workData,
    const std::vector<HighsInt>& pass_workGroup) {
  double finalCompare = 0;
  for (HighsInt i = 0; i < pass_workCount; i++)
    finalCompare = max(finalCompare, pass_workData[i].second);
  finalCompare = min(0.1 * finalCompare, 1.0);
  HighsInt countGroup = pass_workGroup.size() - 1;
  breakGroup = -1;
  breakIndex = -1;
  for (HighsInt iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
    double dMaxFinal = 0;
    HighsInt iMaxFinal = -1;
    for (HighsInt i = pass_workGroup[iGroup]; i < pass_workGroup[iGroup + 1];
         i++) {
      if (dMaxFinal < pass_workData[i].second) {
        dMaxFinal = pass_workData[i].second;
        iMaxFinal = i;
      } else if (dMaxFinal == pass_workData[i].second) {
        HighsInt jCol = pass_workData[iMaxFinal].first;
        HighsInt iCol = pass_workData[i].first;
        if (workNumTotPermutation[iCol] < workNumTotPermutation[jCol]) {
          iMaxFinal = i;
        }
      }
    }

    if (pass_workData[iMaxFinal].second > finalCompare) {
      breakIndex = iMaxFinal;
      breakGroup = iGroup;
      break;
    }
  }
}